

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  counting_iterator cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  _Distance __n;
  
  uVar14 = this->num_digits_;
  uVar10 = (ulong)uVar14;
  iVar3 = this->exp_;
  lVar15 = (long)(int)uVar14;
  uVar6 = iVar3 + uVar14;
  uVar9 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar9 & 0xff) == 1) {
    iVar3 = (this->specs_).precision - uVar14;
    bVar16 = (byte)(uVar9 >> 0x15) & 0 < iVar3;
    lVar15 = lVar15 + -1;
    if ((int)uVar14 < 2) {
      lVar15 = 0;
    }
    lVar12 = it.count_ + lVar15 + (ulong)(1 < (int)uVar14 | bVar16);
    lVar15 = (ulong)(iVar3 - 1) + 1;
    if (bVar16 == 0) {
      lVar15 = 0;
    }
    uVar6 = uVar6 - 1;
    lVar11 = lVar15 + lVar12 + 3;
    uVar14 = -uVar6;
    if (0 < (int)uVar6) {
      uVar14 = uVar6;
    }
    lVar15 = lVar15 + 4 + lVar12;
    if (uVar14 < 1000) {
      lVar15 = lVar11;
    }
    lVar15 = lVar15 + 1;
    if (uVar14 < 100) {
      lVar15 = lVar11;
    }
  }
  else {
    if (iVar3 < 0) {
      if ((int)uVar6 < 1) {
        iVar7 = -uVar6;
        iVar3 = (this->specs_).precision;
        iVar8 = iVar7;
        if (SBORROW4(iVar3,iVar7) != (int)(iVar3 + uVar6) < 0) {
          iVar8 = iVar3;
        }
        if (iVar3 < 0) {
          iVar8 = iVar7;
        }
        if (0 < (int)uVar14 && (uVar9 >> 0x15 & 1) == 0) {
          do {
            if (this->digits_[uVar10 - 1] != '0') goto LAB_0011ea33;
            bVar2 = 1 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar2);
          uVar10 = 0;
        }
LAB_0011ea33:
        iVar3 = (int)uVar10;
        if (iVar8 != 0 || iVar3 != 0) {
          sVar4 = it.count_ + 3 + (ulong)(iVar8 - 1);
          if (iVar8 < 1) {
            sVar4 = it.count_ + 2;
          }
          cVar5.count_ = (long)iVar3 + sVar4;
          if (iVar3 < 1) {
            cVar5.count_ = sVar4;
          }
          return (counting_iterator)cVar5.count_;
        }
        pcVar13 = (char *)(it.count_ + 1);
      }
      else {
        pcVar1 = this->digits_;
        uVar10 = (ulong)uVar6;
        lVar12 = uVar10 + (it.count_ - (long)pcVar1);
        if ((uVar9 >> 0x15 & 1) != 0) {
          lVar12 = (lVar15 - uVar10) + lVar12;
          iVar3 = (this->specs_).precision;
          iVar8 = iVar3 - uVar14;
          if (iVar8 == 0 || iVar3 < (int)uVar14) {
            return (counting_iterator)(size_t)(pcVar1 + lVar12 + 1);
          }
          cVar5.count_ = (size_t)(pcVar1 + lVar12 + 1);
          if (0 < iVar8) {
            cVar5.count_ = (size_t)(pcVar1 + (ulong)(iVar8 - 1) + lVar12 + 2);
          }
          return (counting_iterator)cVar5.count_;
        }
        uVar9 = uVar14 - 1;
        if ((int)uVar6 < (int)(uVar14 - 1)) {
          uVar9 = uVar6;
        }
        do {
          if (pcVar1[lVar15 + -1] != '0') {
            uVar9 = (uint)lVar15;
            break;
          }
          lVar15 = lVar15 + -1;
        } while ((long)uVar10 < lVar15);
        pcVar13 = pcVar1 + (ulong)(uVar9 != uVar6) + (it.count_ - (long)pcVar1) + (long)(int)uVar9;
        if ((int)uVar9 <= (int)uVar6) {
          pcVar13 = pcVar1 + (ulong)(uVar9 != uVar6) + lVar12;
        }
      }
      return (counting_iterator)(size_t)pcVar13;
    }
    lVar12 = 0;
    if (iVar3 != 0) {
      lVar12 = (ulong)(iVar3 - 1) + 1;
    }
    cVar5.count_ = lVar15 + it.count_;
    if ((int)uVar14 < 1) {
      cVar5.count_ = it.count_;
    }
    sVar4 = cVar5.count_ + lVar12;
    if ((uVar9 >> 0x15 & 1) == 0) {
      return (counting_iterator)sVar4;
    }
    iVar3 = (this->specs_).precision;
    iVar8 = iVar3 - uVar6;
    if (iVar8 != 0 && (int)uVar6 <= iVar3) {
      return (counting_iterator)(sVar4 + (iVar8 - 1) + 2);
    }
    lVar15 = sVar4 - ((uVar9 & 0xff) == 2);
  }
  return (counting_iterator)(lVar15 + 2);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }